

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day-or-night.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  int b;
  int g;
  int r;
  ulong local_38;
  ulong uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  while( true ) {
    iVar1 = __isoc99_scanf("%d,%d,%d",&b,&g,&r);
    if (iVar1 == -1) break;
    local_38 = local_38 + (long)((g + r + b) / 3);
    uStack_30 = uStack_30 + 1;
  }
  pcVar3 = "night";
  if (0.3 < ((((double)(local_38 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(local_38 & 0xffffffff | 0x4330000000000000)) /
            (((double)(uStack_30 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
            (double)(uStack_30 & 0xffffffff | 0x4330000000000000))) / 255.0) {
    pcVar3 = "day";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main() {
  int r, g, b;
  uint64_t total_gray = 0,  pixels = 0;
  while (std::scanf("%d,%d,%d", &b, &g, &r) != EOF) {
    total_gray += (r + g + b) / 3;
    pixels += 1;
  }
  const double rate = double(total_gray) / double(pixels) / 255;
  std::cout << (rate > 0.3 ? "day" : "night") << std::endl;
  return 0;
}